

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::extractBits(APInt *this,uint numBits,uint bitPosition)

{
  ulong uVar1;
  APInt *that;
  uint in_ECX;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  uint uVar4;
  undefined4 in_register_00000034;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  anon_union_8_2_1313ab2f_for_U aVar9;
  uint uVar10;
  bool bVar11;
  APInt AVar12;
  ArrayRef<unsigned_long> bigVal;
  APInt Result;
  undefined8 extraout_RDX_01;
  
  puVar5 = (ulong *)CONCAT44(in_register_00000034,numBits);
  if (bitPosition == 0) {
    __assert_fail("numBits > 0 && \"Can\'t extract zero bits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x194,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  uVar4 = (uint)puVar5[1];
  if ((uVar4 <= in_ECX) || (uVar4 < in_ECX + bitPosition)) {
    __assert_fail("bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth && \"Illegal bit extraction\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x196,"APInt llvm::APInt::extractBits(unsigned int, unsigned int) const");
  }
  if (uVar4 < 0x41) {
    uVar1 = *puVar5;
    uVar4 = in_ECX;
  }
  else {
    uVar4 = in_ECX & 0x3f;
    uVar10 = in_ECX >> 6;
    iVar2 = ((in_ECX + bitPosition) - 1 >> 6) - uVar10;
    if (iVar2 != 0) {
      if (uVar4 == 0) {
        bigVal.Length._0_4_ = iVar2 + 1;
        bigVal.Data = (unsigned_long *)((ulong)(uVar10 << 3) + *puVar5);
        bigVal.Length._4_4_ = 0;
        APInt(this,bitPosition,bigVal);
        uVar3 = extraout_RDX_01;
      }
      else {
        APInt(&Result,bitPosition,0,false);
        uVar1 = puVar5[1];
        aVar9.pVal = (uint64_t *)&Result;
        if (0x40 < (ulong)Result.BitWidth) {
          aVar9 = Result.U;
        }
        uVar6 = (ulong)Result.BitWidth + 0x3f >> 6;
        uVar7 = (ulong)uVar10;
        while( true ) {
          uVar7 = uVar7 + 1;
          bVar11 = uVar6 == 0;
          uVar6 = uVar6 - 1;
          if (bVar11) break;
          if (uVar7 < (ulong)(uint)uVar1 + 0x3f >> 6) {
            lVar8 = *(long *)(*puVar5 + uVar7 * 8);
          }
          else {
            lVar8 = 0;
          }
          *aVar9.pVal = lVar8 << (0x40U - (sbyte)uVar4 & 0x3f) |
                        *(ulong *)((*puVar5 - 8) + uVar7 * 8) >> (sbyte)uVar4;
          aVar9.pVal = (uint64_t *)(aVar9.VAL + 8);
        }
        that = clearUnusedBits(&Result);
        APInt(this,that);
        ~APInt(&Result);
        uVar3 = extraout_RDX_00;
      }
      goto LAB_0016749f;
    }
    uVar1 = *(ulong *)(*puVar5 + (ulong)uVar10 * 8);
  }
  APInt(this,bitPosition,uVar1 >> ((byte)uVar4 & 0x3f),false);
  uVar3 = extraout_RDX;
LAB_0016749f:
  AVar12._8_8_ = uVar3;
  AVar12.U.pVal = (uint64_t *)this;
  return AVar12;
}

Assistant:

APInt APInt::extractBits(unsigned numBits, unsigned bitPosition) const {
  assert(numBits > 0 && "Can't extract zero bits");
  assert(bitPosition < BitWidth && (numBits + bitPosition) <= BitWidth &&
         "Illegal bit extraction");

  if (isSingleWord())
    return APInt(numBits, U.VAL >> bitPosition);

  unsigned loBit = whichBit(bitPosition);
  unsigned loWord = whichWord(bitPosition);
  unsigned hiWord = whichWord(bitPosition + numBits - 1);

  // Single word result extracting bits from a single word source.
  if (loWord == hiWord)
    return APInt(numBits, U.pVal[loWord] >> loBit);

  // Extracting bits that start on a source word boundary can be done
  // as a fast memory copy.
  if (loBit == 0)
    return APInt(numBits, makeArrayRef(U.pVal + loWord, 1 + hiWord - loWord));

  // General case - shift + copy source words directly into place.
  APInt Result(numBits, 0);
  unsigned NumSrcWords = getNumWords();
  unsigned NumDstWords = Result.getNumWords();

  uint64_t *DestPtr = Result.isSingleWord() ? &Result.U.VAL : Result.U.pVal;
  for (unsigned word = 0; word < NumDstWords; ++word) {
    uint64_t w0 = U.pVal[loWord + word];
    uint64_t w1 =
        (loWord + word + 1) < NumSrcWords ? U.pVal[loWord + word + 1] : 0;
    DestPtr[word] = (w0 >> loBit) | (w1 << (APINT_BITS_PER_WORD - loBit));
  }

  return Result.clearUnusedBits();
}